

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

void __thiscall
tchecker::parsing::system::parser_t::basic_symbol<tchecker::parsing::system::parser_t::by_state>::
move(basic_symbol<tchecker::parsing::system::parser_t::by_state> *this,
    basic_symbol<tchecker::parsing::system::parser_t::by_state> *s)

{
  counter_type cVar1;
  symbol_kind_type sVar2;
  basic_symbol<tchecker::parsing::system::parser_t::by_state> *s_local;
  basic_symbol<tchecker::parsing::system::parser_t::by_state> *this_local;
  
  by_state::move(&this->super_by_state,&s->super_by_state);
  sVar2 = by_state::kind(&this->super_by_state);
  switch(sVar2) {
  case S_TOK_ID:
  case S_TOK_INTEGER:
  case S_TOK_TEXT:
  case S_text_or_empty:
    value_type::move<std::__cxx11::string>(&this->value,&s->value);
    break;
  default:
    break;
  case S_attr_list:
  case S_non_empty_attr_list:
    value_type::move<tchecker::parsing::attributes_t>(&this->value,&s->value);
    break;
  case S_attr:
    value_type::move<std::shared_ptr<tchecker::parsing::attr_t>>(&this->value,&s->value);
    break;
  case S_sync_constraint_list:
    value_type::
    move<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
              (&this->value,&s->value);
    break;
  case S_sync_constraint:
    value_type::move<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(&this->value,&s->value);
    break;
  case S_sync_strength:
    value_type::move<tchecker::sync_strength_t>(&this->value,&s->value);
    break;
  case S_integer:
    value_type::move<int>(&this->value,&s->value);
    break;
  case S_uinteger:
    value_type::move<unsigned_int>(&this->value,&s->value);
  }
  (this->location).begin.filename = (s->location).begin.filename;
  cVar1 = (s->location).begin.column;
  (this->location).begin.line = (s->location).begin.line;
  (this->location).begin.column = cVar1;
  (this->location).end.filename = (s->location).end.filename;
  cVar1 = (s->location).end.column;
  (this->location).end.line = (s->location).end.line;
  (this->location).end.column = cVar1;
  return;
}

Assistant:

void
  parser_t::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_sync_strength: // sync_strength
        value.move< enum tchecker::sync_strength_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_attr: // attr
        value.move< std::shared_ptr<tchecker::parsing::attr_t> > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        value.move< std::shared_ptr<tchecker::parsing::sync_constraint_t> > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        value.move< std::string > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        value.move< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_integer: // integer
        value.move< tchecker::integer_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        value.move< tchecker::parsing::attributes_t > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_uinteger: // uinteger
        value.move< unsigned int > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }